

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall ArgsManager::GetChainArg_abi_cxx11_(ArgsManager *this)

{
  long lVar1;
  string_view chain;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  bool bVar10;
  runtime_error *this_00;
  _Optional_payload_base<ChainType> __t;
  char *in_RSI;
  variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  bool fTestNet4;
  bool fTestNet;
  bool fSigNet;
  bool fRegTest;
  anon_class_8_1_8991fb9c get_net;
  optional<ChainType> parsed;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  chain_arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  ChainType *in_stack_fffffffffffffe50;
  variant<ChainType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe68;
  string *strArg;
  undefined7 in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  string *in_stack_fffffffffffffe90;
  string *arg;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  size_t in_stack_ffffffffffffff18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
             (char *)in_stack_fffffffffffffe90,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  bVar2 = GetChainArg::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)
                     CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                     in_stack_fffffffffffffe90);
  std::__cxx11::string::~string(in_stack_fffffffffffffe48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1f);
  bVar3 = bVar2 & 1;
  arg = (string *)&stack0xffffffffffffff1e;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar2,in_stack_fffffffffffffe98),(char *)arg,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  bVar4 = GetChainArg::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)CONCAT17(bVar2,in_stack_fffffffffffffe98),arg);
  std::__cxx11::string::~string(in_stack_fffffffffffffe48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1e);
  bVar5 = bVar4 & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar2,in_stack_fffffffffffffe98),(char *)arg,
             (allocator<char> *)CONCAT17(bVar4,in_stack_fffffffffffffe88));
  bVar6 = GetChainArg::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)CONCAT17(bVar2,in_stack_fffffffffffffe98),arg);
  std::__cxx11::string::~string(in_stack_fffffffffffffe48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1d);
  bVar7 = bVar6 & 1;
  strArg = (string *)&stack0xffffffffffffff1c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar2,in_stack_fffffffffffffe98),(char *)arg,
             (allocator<char> *)CONCAT17(bVar4,in_stack_fffffffffffffe88));
  bVar8 = GetChainArg::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)CONCAT17(bVar2,in_stack_fffffffffffffe98),arg);
  std::__cxx11::string::~string(in_stack_fffffffffffffe48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1c);
  bVar9 = bVar8 & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar2,in_stack_fffffffffffffe98),(char *)arg,
             (allocator<char> *)CONCAT17(bVar4,in_stack_fffffffffffffe88));
  GetArg((ArgsManager *)CONCAT17(bVar6,in_stack_fffffffffffffe78),strArg);
  std::__cxx11::string::~string(in_stack_fffffffffffffe48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1b);
  bVar10 = std::
           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffe48);
  if ((byte)(bVar10 + bVar3 + bVar5 + bVar7 + bVar9) < 2) {
    bVar10 = std::optional::operator_cast_to_bool
                       ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffe48);
    if (bVar10) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffe48);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar8,in_stack_fffffffffffffe68));
      chain._M_str = in_RSI;
      chain._M_len = in_stack_ffffffffffffff18;
      __t = (_Optional_payload_base<ChainType>)ChainTypeFromString(chain);
      bVar10 = std::optional::operator_cast_to_bool
                         ((optional<ChainType> *)in_stack_fffffffffffffe48);
      if (bVar10) {
        std::optional<ChainType>::operator*((optional<ChainType> *)in_stack_fffffffffffffe48);
        std::variant<ChainType,std::__cxx11::string>::variant<ChainType&,void,void,ChainType,void>
                  (in_stack_fffffffffffffe58,(ChainType *)__t);
      }
      else {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffffe48);
        std::variant<ChainType,std::__cxx11::string>::
        variant<std::__cxx11::string_const&,void,void,std::__cxx11::string,void>
                  (in_stack_fffffffffffffe58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__t);
      }
    }
    else if (bVar3 == 0) {
      if (bVar5 == 0) {
        if (bVar7 == 0) {
          if (bVar9 == 0) {
            std::variant<ChainType,std::__cxx11::string>::
            variant<ChainType,void,void,ChainType,void>
                      (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
          }
          else {
            std::variant<ChainType,std::__cxx11::string>::
            variant<ChainType,void,void,ChainType,void>
                      (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
          }
        }
        else {
          std::variant<ChainType,std::__cxx11::string>::variant<ChainType,void,void,ChainType,void>
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        }
      }
      else {
        std::variant<ChainType,std::__cxx11::string>::variant<ChainType,void,void,ChainType,void>
                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      }
    }
    else {
      std::variant<ChainType,std::__cxx11::string>::variant<ChainType,void,void,ChainType,void>
                (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffe48);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return in_RDI;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "Invalid combination of -regtest, -signet, -testnet, -testnet4 and -chain. Can use at most one."
              );
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

std::variant<ChainType, std::string> ArgsManager::GetChainArg() const
{
    auto get_net = [&](const std::string& arg) {
        LOCK(cs_args);
        common::SettingsValue value = common::GetSetting(m_settings, /* section= */ "", SettingName(arg),
            /* ignore_default_section_config= */ false,
            /*ignore_nonpersistent=*/false,
            /* get_chain_type= */ true);
        return value.isNull() ? false : value.isBool() ? value.get_bool() : InterpretBool(value.get_str());
    };

    const bool fRegTest = get_net("-regtest");
    const bool fSigNet  = get_net("-signet");
    const bool fTestNet = get_net("-testnet");
    const bool fTestNet4 = get_net("-testnet4");
    const auto chain_arg = GetArg("-chain");

    if ((int)chain_arg.has_value() + (int)fRegTest + (int)fSigNet + (int)fTestNet + (int)fTestNet4 > 1) {
        throw std::runtime_error("Invalid combination of -regtest, -signet, -testnet, -testnet4 and -chain. Can use at most one.");
    }
    if (chain_arg) {
        if (auto parsed = ChainTypeFromString(*chain_arg)) return *parsed;
        // Not a known string, so return original string
        return *chain_arg;
    }
    if (fRegTest) return ChainType::REGTEST;
    if (fSigNet) return ChainType::SIGNET;
    if (fTestNet) return ChainType::TESTNET;
    if (fTestNet4) return ChainType::TESTNET4;
    return ChainType::MAIN;
}